

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_HonorTiles_Wind_Test::testBody
          (TEST_DoublingFactorCounterTest_HonorTiles_Wind_Test *this)

{
  size_type sVar1;
  size_type sVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  char *pcVar5;
  WiningState *this_00;
  unsigned_long in_stack_fffffffffffffb48;
  undefined4 uVar8;
  undefined8 uVar6;
  int iVar9;
  NormalTestTerminator *pNVar7;
  NormalTestTerminator local_2c8;
  NormalTestTerminator local_2c0;
  SimpleString local_2b8;
  SimpleString local_2b0;
  NormalTestTerminator local_2a8;
  NormalTestTerminator local_2a0;
  key_type local_294;
  SimpleString local_290;
  SimpleString local_288;
  key_type local_27c [3];
  DoublingFactorReport local_270;
  NormalTestTerminator local_1e8;
  NormalTestTerminator local_1e0;
  SimpleString local_1d8;
  SimpleString local_1d0;
  NormalTestTerminator local_1c8;
  NormalTestTerminator local_1c0;
  key_type local_1b4;
  SimpleString local_1b0;
  SimpleString local_1a8;
  key_type local_19c [3];
  DoublingFactorReport local_190;
  NormalTestTerminator local_108;
  NormalTestTerminator local_100;
  SimpleString local_f8;
  SimpleString local_f0;
  NormalTestTerminator local_e8;
  NormalTestTerminator local_e0;
  key_type local_d4;
  SimpleString local_d0;
  SimpleString local_c8;
  key_type local_bc [6];
  key_type local_a4;
  undefined1 local_a0 [8];
  DoublingFactorReport r;
  TEST_DoublingFactorCounterTest_HonorTiles_Wind_Test *this_local;
  
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).s;
  mahjong::WiningState::setRoundWind(this_00,EastWind);
  mahjong::WiningState::setSeatWind(this_00,SouthWind);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addPair
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,WhiteDragon);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,OneOfCharacters,true);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,TwoOfCircles,false);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,TwoOfBamboos,false);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addTriplet
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,EastWind,false);
  r.doubling_factor = 0;
  mahjong::WiningState::selfDrawn(this_00,(SelfDrawnSituation)0x0);
  mahjong::DoubligFactorCounter::report
            ((DoublingFactorReport *)local_a0,
             &(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).c);
  local_a4 = EastWind;
  sVar1 = std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
          ::count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,&local_a4);
  if (sVar1 == 1) {
    pUVar3 = UtestShell::getCurrent();
    local_e8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar7 = &local_e8;
    NormalTestTerminator::NormalTestTerminator(pNVar7);
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1df);
    iVar9 = (int)((ulong)pNVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1a4f4f);
  }
  else {
    local_bc[1] = 0xe;
    sVar1 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_bc + 1);
    local_bc[0] = EastWind;
    sVar2 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_bc);
    if (sVar1 != sVar2) {
      pUVar3 = UtestShell::getCurrent();
      (*pUVar3->_vptr_UtestShell[0x1b])
                (pUVar3,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                 ,0x1df);
    }
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)(in_stack_fffffffffffffb48 >> 0x20));
    pcVar4 = SimpleString::asCharString(&local_c8);
    local_d4 = EastWind;
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
    count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> *)
          &r.wining_hand.last_tile,&local_d4);
    StringFrom(in_stack_fffffffffffffb48);
    uVar8 = (undefined4)(in_stack_fffffffffffffb48 >> 0x20);
    pcVar5 = SimpleString::asCharString(&local_d0);
    local_e0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_e0);
    uVar6 = CONCAT44(uVar8,0x1df);
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,uVar6,&local_e0);
    iVar9 = (int)((ulong)uVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1a4e63);
    SimpleString::~SimpleString((SimpleString *)0x1a4e6f);
    SimpleString::~SimpleString((SimpleString *)0x1a4e7b);
  }
  if (r.patterns._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 1) {
    pUVar3 = UtestShell::getCurrent();
    local_108.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar7 = &local_108;
    NormalTestTerminator::NormalTestTerminator(pNVar7);
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1e0);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1a517c);
  }
  else {
    pUVar3 = UtestShell::getCurrent();
    StringFrom(iVar9);
    pcVar4 = SimpleString::asCharString(&local_f0);
    StringFrom(iVar9);
    pcVar5 = SimpleString::asCharString(&local_f8);
    local_100.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_100);
    pNVar7 = (NormalTestTerminator *)CONCAT44(iVar9,0x1e0);
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,pNVar7,&local_100);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1a5090);
    SimpleString::~SimpleString((SimpleString *)0x1a509c);
    SimpleString::~SimpleString((SimpleString *)0x1a50a8);
  }
  mahjong::WiningState::setSeatWind
            (&(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).s,EastWind);
  mahjong::DoubligFactorCounter::report
            (&local_190,&(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).c);
  mahjong::DoublingFactorReport::operator=((DoublingFactorReport *)local_a0,&local_190);
  mahjong::DoublingFactorReport::~DoublingFactorReport(&local_190);
  local_19c[2] = 0x12;
  sVar1 = std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
          ::count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_19c + 2);
  if (sVar1 == 1) {
    pUVar3 = UtestShell::getCurrent();
    local_1c8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar7 = &local_1c8;
    NormalTestTerminator::NormalTestTerminator(pNVar7);
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1e5);
    iVar9 = (int)((ulong)pNVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1a54a4);
  }
  else {
    local_19c[1] = 0x12;
    sVar1 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_19c + 1);
    local_19c[0] = DoubleEastWind;
    sVar2 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_19c);
    if (sVar1 != sVar2) {
      pUVar3 = UtestShell::getCurrent();
      (*pUVar3->_vptr_UtestShell[0x1b])
                (pUVar3,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                 ,0x1e5);
    }
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)((ulong)pNVar7 >> 0x20));
    pcVar4 = SimpleString::asCharString(&local_1a8);
    local_1b4 = DoubleEastWind;
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
    count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> *)
          &r.wining_hand.last_tile,&local_1b4);
    StringFrom((unsigned_long)pNVar7);
    uVar8 = (undefined4)((ulong)pNVar7 >> 0x20);
    pcVar5 = SimpleString::asCharString(&local_1b0);
    local_1c0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_1c0);
    uVar6 = CONCAT44(uVar8,0x1e5);
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,uVar6,&local_1c0);
    iVar9 = (int)((ulong)uVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1a53b8);
    SimpleString::~SimpleString((SimpleString *)0x1a53c4);
    SimpleString::~SimpleString((SimpleString *)0x1a53d0);
  }
  if (r.patterns._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 2) {
    pUVar3 = UtestShell::getCurrent();
    local_1e8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar7 = &local_1e8;
    NormalTestTerminator::NormalTestTerminator(pNVar7);
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1e6);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1a56d1);
  }
  else {
    pUVar3 = UtestShell::getCurrent();
    StringFrom(iVar9);
    pcVar4 = SimpleString::asCharString(&local_1d0);
    StringFrom(iVar9);
    pcVar5 = SimpleString::asCharString(&local_1d8);
    local_1e0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_1e0);
    pNVar7 = (NormalTestTerminator *)CONCAT44(iVar9,0x1e6);
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,pNVar7,&local_1e0);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1a55e5);
    SimpleString::~SimpleString((SimpleString *)0x1a55f1);
    SimpleString::~SimpleString((SimpleString *)0x1a55fd);
  }
  mahjong::WiningState::setRoundWind
            (&(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).s,SouthWind);
  mahjong::DoubligFactorCounter::report
            (&local_270,&(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).c);
  mahjong::DoublingFactorReport::operator=((DoublingFactorReport *)local_a0,&local_270);
  mahjong::DoublingFactorReport::~DoublingFactorReport(&local_270);
  local_27c[2] = 0xe;
  sVar1 = std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
          ::count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_27c + 2);
  if (sVar1 == 1) {
    pUVar3 = UtestShell::getCurrent();
    local_2a8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar7 = &local_2a8;
    NormalTestTerminator::NormalTestTerminator(pNVar7);
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1eb);
    iVar9 = (int)((ulong)pNVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1a59f9);
  }
  else {
    local_27c[1] = 0xe;
    sVar1 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_27c + 1);
    local_27c[0] = EastWind;
    sVar2 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_27c);
    if (sVar1 != sVar2) {
      pUVar3 = UtestShell::getCurrent();
      (*pUVar3->_vptr_UtestShell[0x1b])
                (pUVar3,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                 ,0x1eb);
    }
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)((ulong)pNVar7 >> 0x20));
    pcVar4 = SimpleString::asCharString(&local_288);
    local_294 = EastWind;
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
    count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> *)
          &r.wining_hand.last_tile,&local_294);
    StringFrom((unsigned_long)pNVar7);
    uVar8 = (undefined4)((ulong)pNVar7 >> 0x20);
    pcVar5 = SimpleString::asCharString(&local_290);
    local_2a0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_2a0);
    uVar6 = CONCAT44(uVar8,0x1eb);
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,uVar6,&local_2a0);
    iVar9 = (int)((ulong)uVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1a590d);
    SimpleString::~SimpleString((SimpleString *)0x1a5919);
    SimpleString::~SimpleString((SimpleString *)0x1a5925);
  }
  if (r.patterns._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 1) {
    pUVar3 = UtestShell::getCurrent();
    local_2c8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_2c8);
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1ec,&local_2c8);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1a5c26);
  }
  else {
    pUVar3 = UtestShell::getCurrent();
    StringFrom(iVar9);
    pcVar4 = SimpleString::asCharString(&local_2b0);
    StringFrom(iVar9);
    pcVar5 = SimpleString::asCharString(&local_2b8);
    local_2c0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_2c0);
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,CONCAT44(iVar9,0x1ec),&local_2c0);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1a5b3a);
    SimpleString::~SimpleString((SimpleString *)0x1a5b46);
    SimpleString::~SimpleString((SimpleString *)0x1a5b52);
  }
  mahjong::DoublingFactorReport::~DoublingFactorReport((DoublingFactorReport *)local_a0);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, HonorTiles_Wind)
{
	s.setRoundWind(Tile::EastWind);
	s.setSeatWind(Tile::SouthWind);

	addPair(Tile::WhiteDragon);
	addSequence(Tile::OneOfCharacters, true);
	addSequence(Tile::TwoOfCircles, false);
	addSequence(Tile::TwoOfBamboos, false);
	addTriplet(Tile::EastWind, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::EastWind));
	CHECK_EQUAL(1, r.doubling_factor);

	s.setSeatWind(Tile::EastWind);	
	r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::DoubleEastWind));
	CHECK_EQUAL(2, r.doubling_factor);

	s.setRoundWind(Tile::SouthWind);
	r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::EastWind));
	CHECK_EQUAL(1, r.doubling_factor);
}